

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int line_x1_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_18 [8];
  Am_Object node;
  Am_Object *self_local;
  
  _node = self;
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)START_NODE);
  Am_Object::Am_Object(local_18,pAVar4);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) == 0) {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)_node,(ulong)END_NODE);
    Am_Object::operator=(local_18,pAVar4);
  }
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_18,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_18,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(local_18);
  return iVar2 + iVar3 / 2;
}

Assistant:

Am_Define_Formula(int, line_x1)
{
  Am_Object node = self.Get(START_NODE);
  if (!node.Valid())
    node = self.Get(END_NODE);
  return (int)node.Get(Am_LEFT) + (int)node.Get(Am_WIDTH) / 2;
}